

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  long *plVar1;
  Env *pEVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  Status result;
  Status del;
  FileType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  FileLock *lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint64_t number;
  string lockname;
  long *local_f0;
  char *local_e8;
  FileType local_dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  leveldb *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  void *local_70;
  void *local_68;
  void *local_60;
  uint64_t local_58;
  string local_50;
  
  pEVar2 = options->env;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pEVar2->_vptr_Env[7])(&local_f0,pEVar2,dbname);
  if (local_f0 == (long *)0x0) {
    LockFileName(&local_50,dbname);
    (*pEVar2->_vptr_Env[0xf])(&local_b8,pEVar2,&local_50,&local_98);
    plVar1 = local_f0;
    local_f0 = local_b8;
    local_b8 = plVar1;
    if (plVar1 != (long *)0x0) {
      operator_delete__(plVar1);
    }
    if (local_f0 == (long *)0x0) {
      local_c0 = this;
      if (local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          bVar4 = ParseFileName((string *)
                                ((long)&((local_d8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7),&local_58,&local_dc);
          if ((bVar4) && (local_dc != kDBLockFile)) {
            local_90[0] = local_80;
            pcVar3 = (dbname->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar3,pcVar3 + dbname->_M_string_length);
            std::__cxx11::string::append((char *)local_90);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_90,
                                        *(ulong *)((long)&((local_d8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar7));
            plVar1 = plVar5 + 2;
            if ((long *)*plVar5 == plVar1) {
              local_a8 = *plVar1;
              uStack_a0 = (undefined4)plVar5[3];
              uStack_9c = *(undefined4 *)((long)plVar5 + 0x1c);
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *plVar1;
              local_b8 = (long *)*plVar5;
            }
            local_b0 = plVar5[1];
            *plVar5 = (long)plVar1;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            (*pEVar2->_vptr_Env[8])(&local_e8,pEVar2,&local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0]);
            }
            if ((local_f0 == (long *)0x0) && (local_e8 != (char *)0x0)) {
              if (local_e8 == (char *)0x0) {
                local_f0 = (long *)0x0;
              }
              else {
                local_f0 = (long *)Status::CopyState(local_e8);
              }
            }
            if (local_e8 != (char *)0x0) {
              operator_delete__(local_e8);
            }
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar6 < (ulong)((long)local_d8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_d8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      (*pEVar2->_vptr_Env[0x10])(&local_60,pEVar2,local_98);
      if (local_60 != (void *)0x0) {
        operator_delete__(local_60);
      }
      (*pEVar2->_vptr_Env[8])(&local_68,pEVar2,&local_50);
      if (local_68 != (void *)0x0) {
        operator_delete__(local_68);
      }
      (*pEVar2->_vptr_Env[0xb])(&local_70,pEVar2,dbname);
      this = local_c0;
      if (local_70 != (void *)0x0) {
        operator_delete__(local_70);
      }
    }
    *(long **)this = local_f0;
    local_f0 = (long *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (local_f0 != (long *)0x0) {
    operator_delete__(local_f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->RemoveFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->RemoveFile(lockname);
    env->RemoveDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}